

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

void glad_gl_load_GL_ARB_robustness(GLADuserptrloadfunc load,void *userptr)

{
  void *userptr_local;
  GLADuserptrloadfunc load_local;
  
  if (GLAD_GL_ARB_robustness != 0) {
    glad_glGetGraphicsResetStatusARB =
         (PFNGLGETGRAPHICSRESETSTATUSARBPROC)(*load)(userptr,"glGetGraphicsResetStatusARB");
    glad_glGetnColorTableARB = (PFNGLGETNCOLORTABLEARBPROC)(*load)(userptr,"glGetnColorTableARB");
    glad_glGetnCompressedTexImageARB =
         (PFNGLGETNCOMPRESSEDTEXIMAGEARBPROC)(*load)(userptr,"glGetnCompressedTexImageARB");
    glad_glGetnConvolutionFilterARB =
         (PFNGLGETNCONVOLUTIONFILTERARBPROC)(*load)(userptr,"glGetnConvolutionFilterARB");
    glad_glGetnHistogramARB = (PFNGLGETNHISTOGRAMARBPROC)(*load)(userptr,"glGetnHistogramARB");
    glad_glGetnMapdvARB = (PFNGLGETNMAPDVARBPROC)(*load)(userptr,"glGetnMapdvARB");
    glad_glGetnMapfvARB = (PFNGLGETNMAPFVARBPROC)(*load)(userptr,"glGetnMapfvARB");
    glad_glGetnMapivARB = (PFNGLGETNMAPIVARBPROC)(*load)(userptr,"glGetnMapivARB");
    glad_glGetnMinmaxARB = (PFNGLGETNMINMAXARBPROC)(*load)(userptr,"glGetnMinmaxARB");
    glad_glGetnPixelMapfvARB = (PFNGLGETNPIXELMAPFVARBPROC)(*load)(userptr,"glGetnPixelMapfvARB");
    glad_glGetnPixelMapuivARB = (PFNGLGETNPIXELMAPUIVARBPROC)(*load)(userptr,"glGetnPixelMapuivARB")
    ;
    glad_glGetnPixelMapusvARB = (PFNGLGETNPIXELMAPUSVARBPROC)(*load)(userptr,"glGetnPixelMapusvARB")
    ;
    glad_glGetnPolygonStippleARB =
         (PFNGLGETNPOLYGONSTIPPLEARBPROC)(*load)(userptr,"glGetnPolygonStippleARB");
    glad_glGetnSeparableFilterARB =
         (PFNGLGETNSEPARABLEFILTERARBPROC)(*load)(userptr,"glGetnSeparableFilterARB");
    glad_glGetnTexImageARB = (PFNGLGETNTEXIMAGEARBPROC)(*load)(userptr,"glGetnTexImageARB");
    glad_glGetnUniformdvARB = (PFNGLGETNUNIFORMDVARBPROC)(*load)(userptr,"glGetnUniformdvARB");
    glad_glGetnUniformfvARB = (PFNGLGETNUNIFORMFVARBPROC)(*load)(userptr,"glGetnUniformfvARB");
    glad_glGetnUniformivARB = (PFNGLGETNUNIFORMIVARBPROC)(*load)(userptr,"glGetnUniformivARB");
    glad_glGetnUniformuivARB = (PFNGLGETNUNIFORMUIVARBPROC)(*load)(userptr,"glGetnUniformuivARB");
    glad_glReadnPixelsARB = (PFNGLREADNPIXELSARBPROC)(*load)(userptr,"glReadnPixelsARB");
  }
  return;
}

Assistant:

static void glad_gl_load_GL_ARB_robustness( GLADuserptrloadfunc load, void* userptr) {
    if(!GLAD_GL_ARB_robustness) return;
    glad_glGetGraphicsResetStatusARB = (PFNGLGETGRAPHICSRESETSTATUSARBPROC) load(userptr, "glGetGraphicsResetStatusARB");
    glad_glGetnColorTableARB = (PFNGLGETNCOLORTABLEARBPROC) load(userptr, "glGetnColorTableARB");
    glad_glGetnCompressedTexImageARB = (PFNGLGETNCOMPRESSEDTEXIMAGEARBPROC) load(userptr, "glGetnCompressedTexImageARB");
    glad_glGetnConvolutionFilterARB = (PFNGLGETNCONVOLUTIONFILTERARBPROC) load(userptr, "glGetnConvolutionFilterARB");
    glad_glGetnHistogramARB = (PFNGLGETNHISTOGRAMARBPROC) load(userptr, "glGetnHistogramARB");
    glad_glGetnMapdvARB = (PFNGLGETNMAPDVARBPROC) load(userptr, "glGetnMapdvARB");
    glad_glGetnMapfvARB = (PFNGLGETNMAPFVARBPROC) load(userptr, "glGetnMapfvARB");
    glad_glGetnMapivARB = (PFNGLGETNMAPIVARBPROC) load(userptr, "glGetnMapivARB");
    glad_glGetnMinmaxARB = (PFNGLGETNMINMAXARBPROC) load(userptr, "glGetnMinmaxARB");
    glad_glGetnPixelMapfvARB = (PFNGLGETNPIXELMAPFVARBPROC) load(userptr, "glGetnPixelMapfvARB");
    glad_glGetnPixelMapuivARB = (PFNGLGETNPIXELMAPUIVARBPROC) load(userptr, "glGetnPixelMapuivARB");
    glad_glGetnPixelMapusvARB = (PFNGLGETNPIXELMAPUSVARBPROC) load(userptr, "glGetnPixelMapusvARB");
    glad_glGetnPolygonStippleARB = (PFNGLGETNPOLYGONSTIPPLEARBPROC) load(userptr, "glGetnPolygonStippleARB");
    glad_glGetnSeparableFilterARB = (PFNGLGETNSEPARABLEFILTERARBPROC) load(userptr, "glGetnSeparableFilterARB");
    glad_glGetnTexImageARB = (PFNGLGETNTEXIMAGEARBPROC) load(userptr, "glGetnTexImageARB");
    glad_glGetnUniformdvARB = (PFNGLGETNUNIFORMDVARBPROC) load(userptr, "glGetnUniformdvARB");
    glad_glGetnUniformfvARB = (PFNGLGETNUNIFORMFVARBPROC) load(userptr, "glGetnUniformfvARB");
    glad_glGetnUniformivARB = (PFNGLGETNUNIFORMIVARBPROC) load(userptr, "glGetnUniformivARB");
    glad_glGetnUniformuivARB = (PFNGLGETNUNIFORMUIVARBPROC) load(userptr, "glGetnUniformuivARB");
    glad_glReadnPixelsARB = (PFNGLREADNPIXELSARBPROC) load(userptr, "glReadnPixelsARB");
}